

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikfast61_kukakr10r1100sixx.cpp
# Opt level: O2

bool __thiscall
IKSolver::ComputeIk(IKSolver *this,IkReal *eetrans,IkReal *eerot,IkReal *pfree,
                   IkSolutionListBase<double> *solutions)

{
  undefined1 auVar1 [16];
  undefined4 extraout_EAX;
  int iVar2;
  undefined4 extraout_EAX_00;
  undefined4 extraout_EAX_01;
  undefined8 extraout_RAX;
  undefined4 extraout_var;
  bool bVar3;
  int ij2;
  long lVar4;
  int ij0;
  long lVar5;
  ulong uVar6;
  double dVar7;
  undefined1 auVar17 [16];
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  ulong uVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double extraout_XMM0_Qb;
  undefined1 auVar18 [16];
  double dVar19;
  undefined1 auVar20 [16];
  double dVar21;
  double dVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  undefined1 auVar36 [16];
  double dVar37;
  double dVar38;
  double dVar39;
  undefined1 auVar40 [16];
  double dVar41;
  CheckValue<double> CVar42;
  CheckValue<double> CVar43;
  undefined2 local_1fc;
  undefined2 local_1fa;
  double local_1f8;
  double dStack_1f0;
  double local_1e8;
  uint local_1dc;
  double local_1d8;
  undefined8 uStack_1d0;
  double local_1c8;
  undefined8 uStack_1c0;
  double local_1b0;
  double local_1a8;
  undefined8 uStack_1a0;
  IkReal j2array [2];
  IkReal j0array [2];
  IkReal sj2array [2];
  IkReal cj2array [2];
  IkReal sj0array [2];
  IkReal cj0array [2];
  
  this->j0 = NAN;
  this->j1 = NAN;
  this->j2 = NAN;
  this->j3 = NAN;
  this->j4 = NAN;
  this->j5 = NAN;
  this->_ij0[0] = 0xff;
  this->_ij0[1] = 0xff;
  this->_nj0 = 0xff;
  this->_ij1[0] = 0xff;
  *(undefined4 *)(this->_ij1 + 1) = 0xffffffff;
  this->_nj2 = 0xff;
  this->_ij3[0] = 0xff;
  this->_ij3[1] = 0xff;
  this->_nj3 = 0xff;
  this->_ij4[0] = 0xff;
  this->_ij4[1] = 0xff;
  this->_nj4 = 0xff;
  this->_ij5[0] = 0xff;
  *(undefined2 *)(this->_ij5 + 1) = 0xffff;
  (*solutions->_vptr_IkSolutionListBase[5])(solutions);
  dVar10 = *eerot;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar10;
  this->r00 = dVar10;
  local_1e8 = eerot[1];
  this->r01 = local_1e8;
  dVar8 = eerot[2];
  this->r02 = dVar8;
  local_1d8 = eerot[3];
  this->r10 = local_1d8;
  local_1f8 = eerot[4];
  this->r11 = local_1f8;
  dStack_1f0 = 0.0;
  dVar9 = eerot[5];
  this->r12 = dVar9;
  dVar7 = eerot[6];
  this->r20 = dVar7;
  dVar12 = eerot[7];
  auVar36._8_8_ = 0;
  auVar36._0_8_ = dVar12;
  this->r21 = dVar12;
  dVar11 = eerot[8];
  auVar40._8_8_ = 0;
  auVar40._0_8_ = dVar11;
  this->r22 = dVar11;
  dVar31 = *eetrans;
  this->px = dVar31;
  local_1c8 = eetrans[1];
  uStack_1c0 = 0;
  this->py = local_1c8;
  dVar34 = eetrans[2];
  this->new_r00 = dVar8;
  this->new_r01 = local_1e8;
  auVar25 = _DAT_00133070;
  auVar17 = auVar17 ^ _DAT_00133070;
  auVar23._0_8_ = auVar17._0_8_;
  auVar23._8_4_ = auVar17._0_4_;
  auVar23._12_4_ = auVar17._4_4_;
  this->new_r02 = auVar23._0_8_;
  this->r02 = (IkReal)auVar23._8_8_;
  this->new_r10 = -dVar9;
  this->r10 = -dVar9;
  this->new_r11 = -local_1f8;
  this->r11 = -local_1f8;
  this->new_r12 = local_1d8;
  auVar40 = auVar40 ^ auVar25;
  auVar24._0_8_ = auVar40._0_8_;
  auVar24._8_4_ = auVar40._0_4_;
  auVar24._12_4_ = auVar40._4_4_;
  this->new_r20 = auVar24._0_8_;
  this->r20 = (IkReal)auVar24._8_8_;
  auVar36 = auVar36 ^ auVar25;
  auVar25._0_8_ = auVar36._0_8_;
  auVar25._8_4_ = auVar36._0_4_;
  auVar25._12_4_ = auVar36._4_4_;
  this->new_r21 = auVar25._0_8_;
  this->r21 = (IkReal)auVar25._8_8_;
  uStack_1d0 = 0;
  dVar38 = dVar7 * 0.08 + (0.4 - dVar34);
  dVar31 = dVar10 * -0.08 + dVar31;
  dVar34 = local_1c8 * -1.0 + local_1d8 * 0.08;
  this->new_r22 = dVar7;
  this->new_pz = dVar38;
  this->r00 = dVar8;
  this->r01 = local_1e8;
  this->r12 = local_1d8;
  this->r22 = dVar7;
  this->pz = dVar38;
  this->new_px = dVar31;
  this->px = dVar31;
  this->new_py = dVar34;
  this->py = dVar34;
  this->npx = (dVar31 * dVar8 - dVar34 * dVar9) - dVar38 * dVar11;
  this->npy = (dVar31 * local_1e8 - dVar34 * local_1f8) - dVar38 * dVar12;
  this->npz = auVar23._0_8_ * dVar31 + local_1d8 * dVar34 + dVar7 * dVar38;
  this->pp = dVar31 * dVar31 + dVar34 * dVar34 + dVar38 * dVar38;
  this->rxp0_0 = dVar11 * dVar34 - dVar38 * dVar9;
  this->rxp0_1 = auVar24._0_8_ * dVar31 - dVar38 * dVar8;
  this->rxp0_2 = dVar9 * dVar31 + dVar8 * dVar34;
  this->rxp1_0 = dVar12 * dVar34 - dVar38 * local_1f8;
  this->rxp1_1 = auVar25._0_8_ * dVar31 - dVar38 * local_1e8;
  this->rxp1_2 = local_1f8 * dVar31 + local_1e8 * dVar34;
  this->rxp2_0 = dVar38 * local_1d8 - dVar34 * dVar7;
  this->rxp2_1 = dVar7 * dVar31 + dVar10 * dVar38;
  this->rxp2_2 = -local_1d8 * dVar31 - dVar10 * dVar34;
  if (ABS(ABS(dVar34) + ABS(dVar31)) < 1e-06) goto LAB_0011861e;
  local_1fa = 1;
  this->_nj0 = '\x02';
  CVar42 = IKatan2WithCheck<double>(dVar34,-dVar31,1e-07);
  dVar10 = CVar42.value;
  if (((undefined1  [16])CVar42 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
  goto LAB_0011861e;
  local_1f8 = -dVar10;
  dStack_1f0 = -extraout_XMM0_Qb;
  j0array[0] = local_1f8;
  dVar7 = sin(local_1f8);
  sj0array[0] = dVar7;
  dVar8 = cos(local_1f8);
  local_1f8 = 3.14159265358979 - dVar10;
  j0array[1] = local_1f8;
  cj0array[0] = dVar8;
  local_1e8 = sin(local_1f8);
  sj0array[1] = local_1e8;
  dVar9 = cos(local_1f8);
  cj0array[1] = dVar9;
  if (-3.14159265358979 <= dVar10) {
    if (3.14159265358979 < dVar10) {
      dVar12 = 6.28318530717959;
      goto LAB_00116cbe;
    }
  }
  else {
    dVar12 = -6.28318530717959;
LAB_00116cbe:
    j0array[0] = dVar12 - dVar10;
  }
  if (local_1f8 <= 3.14159265358979) {
    if (local_1f8 < -3.14159265358979) {
      dVar10 = 6.28318530717959;
      goto LAB_00116cfb;
    }
  }
  else {
    dVar10 = -6.28318530717959;
LAB_00116cfb:
    j0array[1] = local_1f8 + dVar10;
  }
  local_1fa = CONCAT11(1,(undefined1)local_1fa);
  dVar7 = dVar7 - local_1e8;
  local_1dc = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
  for (lVar5 = 0; lVar5 != 2; lVar5 = lVar5 + 1) {
    if (*(char *)((long)&local_1fa + lVar5) == '\x01') {
      this->_ij0[0] = (uchar)lVar5;
      this->_ij0[1] = 0xff;
      if ((((lVar5 == 0) && (ABS(dVar8 - dVar9) < 1e-06)) && ((local_1dc & 1) != 0)) &&
         (ABS(dVar7) < 1e-06)) {
        local_1fa = local_1fa & 0xff;
        this->_ij0[1] = '\x01';
        local_1dc = 0;
      }
      this->j0 = j0array[lVar5];
      dVar10 = cj0array[lVar5];
      this->cj0 = dVar10;
      dVar12 = sj0array[lVar5];
      this->sj0 = dVar12;
      local_1fc = 1;
      this->_nj2 = '\x02';
      dVar10 = dVar10 * 0.0864856630609769 * this->px +
               this->py * 0.0864856630609769 * dVar12 +
               this->pp * -1.72971326121954 + 1.00223910638213;
      if (ABS(dVar10) <= 1.0000001) {
        dVar11 = IKasin(dVar10);
        local_1f8 = -1.50293950393859 - dVar11;
        j2array[0] = local_1f8;
        dVar10 = sin(local_1f8);
        sj2array[0] = dVar10;
        dVar12 = cos(local_1f8);
        dVar11 = dVar11 + 1.6386531496512;
        j2array[1] = dVar11;
        cj2array[0] = dVar12;
        local_1e8 = sin(dVar11);
        sj2array[1] = local_1e8;
        dVar31 = cos(dVar11);
        cj2array[1] = dVar31;
        if (local_1f8 <= 3.14159265358979) {
          if (local_1f8 < -3.14159265358979) {
            j2array[0] = local_1f8 + 6.28318530717959;
            goto LAB_00116f42;
          }
        }
        else {
          j2array[0] = local_1f8 + -6.28318530717959;
LAB_00116f42:
        }
        dVar34 = -6.28318530717959;
        if ((3.14159265358979 < dVar11) || (dVar34 = 6.28318530717959, dVar11 < -3.14159265358979))
        {
          j2array[1] = dVar11 + dVar34;
        }
        local_1fc = CONCAT11(1,(undefined1)local_1fc);
        uVar13 = (ulong)DAT_001330a0;
        dVar10 = dVar10 - local_1e8;
        bVar3 = true;
        for (lVar4 = 0; lVar4 != 2; lVar4 = lVar4 + 1) {
          dVar11 = local_1b0;
          if (*(char *)((long)&local_1fc + lVar4) == '\x01') {
            this->_ij2[0] = (uchar)lVar4;
            this->_ij2[1] = 0xff;
            if (((lVar4 == 0) && ((double)((ulong)(dVar12 - dVar31) & uVar13) < 1e-06)) &&
               ((bVar3 && ((double)((ulong)dVar10 & uVar13) < 1e-06)))) {
              local_1fc = local_1fc & 0xff;
              this->_ij2[1] = '\x01';
              bVar3 = false;
            }
            this->j2 = j2array[lVar4];
            dVar34 = cj2array[lVar4];
            this->cj2 = dVar34;
            dVar38 = sj2array[lVar4];
            this->sj2 = dVar38;
            dVar15 = this->cj0;
            dVar16 = this->px;
            dVar41 = dVar34 * dVar38;
            local_1e8 = dVar38 * 0.515;
            dVar11 = this->py;
            dVar21 = this->sj0 * dVar11;
            local_1c8 = dVar34 * 0.035;
            uStack_1c0 = 0;
            dVar22 = this->pz;
            dVar14 = dVar34 * dVar22;
            dVar35 = dVar38 * dVar22;
            dVar29 = dVar34 * dVar34;
            dVar30 = dVar16 * dVar15;
            uStack_1a0 = 0;
            local_1f8 = -dVar30;
            dStack_1f0 = -dVar30;
            local_1d8 = local_1e8 * dVar21;
            local_1b0 = dVar11;
            if (((ABS(ABS(dVar22 * -0.025 +
                          dVar22 * dVar30 +
                          dVar21 * dVar22 +
                          dVar41 * 0.264 +
                          dVar34 * -0.0196 + dVar29 * -0.03605 + dVar38 * 0.2884 + 0.018025) +
                      ABS(dVar41 * 0.03605 + dVar29 * 0.264 + dVar22 * dVar22 + -0.265225)) < 1e-06)
                || (ABS(dVar35 * 40.0 +
                        dVar38 * 588.571428571429 * dVar21 +
                        ((dVar14 * 588.571428571429 +
                         dVar38 * -14.7142857142857 +
                         dVar30 * dVar38 * 588.571428571429 +
                         (dVar22 * 640.0 - dVar30 * dVar34 * 40.0) + dVar34) -
                        dVar34 * 40.0 * dVar21)) < 1e-06)) ||
               (dVar27 = dVar21 * local_1c8,
               dVar34 * 0.000875 +
               ((dVar30 * local_1e8 +
                dVar14 * 0.515 +
                dVar35 * 0.035 + dVar38 * -0.012875 + (dVar22 * 0.56 - dVar30 * local_1c8)) - dVar27
               ) + local_1d8 == 0.0)) {
              dVar26 = -dVar21;
              dVar19 = dVar38 * 0.035;
              dVar32 = dVar34 * 0.515;
              dVar33 = dVar26 * dVar32;
              dVar27 = dVar26 * dVar19;
              dVar37 = dVar30 * -0.56;
              dVar28 = dVar21 * -0.56;
              local_1a8 = local_1f8 * dVar19;
              dVar39 = local_1f8 * dVar32;
              if ((ABS(dVar34 * 588.571428571429 * local_1f8 +
                       dVar35 * 588.571428571429 +
                       dVar30 * -640.0 +
                       dVar21 * -640.0 +
                       ((dVar14 * -40.0 +
                        dVar34 * 14.7142857142857 +
                        dVar26 * dVar38 * 40.0 + dVar26 * dVar34 * 588.571428571429 + dVar38 + 16.0)
                       - dVar38 * 40.0 * dVar30)) < 1e-06) ||
                 (dVar38 * 0.000875 +
                  dVar14 * -0.035 +
                  dVar34 * 0.012875 + dVar35 * 0.515 + 0.014 + dVar33 + dVar27 + dVar37 + dVar28 +
                  local_1a8 + dVar39 == 0.0)) {
                dVar15 = dVar15 * dVar15;
                local_1b0 = dVar11 * dVar11;
                dVar16 = dVar16 * dVar16 * dVar15;
                if (1e-06 <= ABS((dVar22 * dVar22 * -1600.0 +
                                 dVar16 * -1600.0 +
                                 dVar30 * 80.0 +
                                 dVar21 * 80.0 +
                                 dVar30 * -3200.0 * dVar21 + dVar15 * local_1b0 * 1600.0 + -1.0) -
                                 local_1b0 * 1600.0)) {
                  dVar14 = dVar30 * -2.0 * dVar21;
                  dVar29 = dVar15 * local_1b0;
                  if ((((dVar21 * 0.05 + -0.000625 + dVar30 * 0.05 + dVar14 + dVar29) -
                       dVar22 * dVar22) - dVar16) - local_1b0 != 0.0) {
                    this->_nj1 = '\x01';
                    CVar42 = IKatan2WithCheck<double>
                                       (dVar34 * 0.000875 +
                                        local_1f8 * local_1c8 +
                                        dVar30 * local_1e8 +
                                        dVar26 * local_1c8 +
                                        dVar22 * -0.56 +
                                        local_1d8 +
                                        dVar38 * -0.012875 + (-dVar22 * dVar19 - dVar32 * dVar22),
                                        (dVar37 + dVar28 + dVar39 + local_1a8 +
                                                                    dVar38 * 0.000875 +
                                                                    local_1c8 * dVar22 +
                                                                    dVar34 * 0.012875 +
                                                                    dVar27 + dVar33 + 0.014) -
                                        dVar22 * local_1e8,1e-07);
                    dVar11 = local_1b0;
                    if (((undefined1  [16])CVar42 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                    {
                      dVar11 = (((dVar14 + dVar29 + dVar21 * 0.05 + dVar30 * 0.05 + -0.000625) -
                                local_1b0) - this->pz * this->pz) - dVar15 * this->px * this->px;
                      uVar6 = -(ulong)(0.0 < dVar11);
                      CVar43 = IKPowWithIntegerCheck<double>
                                         ((double)(uVar6 & 0x3ff0000000000000 |
                                                  ~uVar6 & -(ulong)(dVar11 < 0.0) &
                                                           0xbff0000000000000),-1);
                      dVar11 = local_1b0;
                      if (((undefined1  [16])CVar43 & (undefined1  [16])0x1) !=
                          (undefined1  [16])0x0) {
                        dVar11 = CVar43.value * 1.5707963267949 + CVar42.value + -1.5707963267949;
                        local_1f8 = sin(dVar11);
                        dVar34 = cos(dVar11);
                        if (dVar11 <= 3.14159265358979) {
                          if (dVar11 < -3.14159265358979) {
                            dVar11 = dVar11 + 6.28318530717959;
                          }
                        }
                        else {
                          dVar11 = dVar11 + -6.28318530717959;
                        }
                        this->_ij1[0] = '\0';
                        this->_ij1[1] = 0xff;
                        this->j1 = dVar11;
                        this->cj1 = dVar34;
                        this->sj1 = local_1f8;
                        dVar16 = sin(dVar11);
                        dVar22 = cos(this->j1);
                        dVar14 = this->cj0 * this->px;
                        dVar21 = this->sj2 * 0.515;
                        dVar34 = this->pz;
                        dVar38 = this->sj0 * this->py;
                        dVar15 = this->cj2 * 0.035;
                        dVar11 = local_1b0;
                        if (ABS((dVar16 * -0.025 +
                                ((dVar14 * dVar16 + dVar16 * dVar38) - dVar15) + dVar21) -
                                dVar34 * dVar22) <= 1e-05) {
                          dVar11 = this->cj2 * 0.515;
                          dVar29 = this->sj2 * 0.035;
                          auVar18._4_4_ =
                               -(uint)(1e-05 < ABS(dVar16 * 0.56 +
                                                   ((dVar11 * dVar16 +
                                                    dVar34 * -1.0 +
                                                    dVar16 * dVar29 + dVar22 * dVar21) -
                                                   dVar22 * dVar15)));
                          auVar18._0_4_ =
                               -(uint)(1e-05 < ABS(dVar16 * -dVar34 +
                                                   ((dVar22 * 0.025 + (0.56 - dVar14 * dVar22) +
                                                     dVar29 + dVar11) - dVar22 * dVar38)));
                          auVar18._8_4_ =
                               -(uint)(1e-05 < ABS(dVar22 * 1.12 * dVar14 +
                                                   dVar14 * 0.05 +
                                                   dVar38 * 0.05 +
                                                   dVar16 * dVar34 * 1.12 +
                                                   dVar22 * -0.028 +
                                                   ((dVar38 * dVar22 * 1.12 + -0.047775) - this->pp)
                                                  ));
                          auVar18._12_4_ =
                               -(uint)(1e-05 < ABS(dVar14 * -1.0 +
                                                   dVar38 * -1.0 +
                                                   dVar15 * dVar16 +
                                                   dVar22 * dVar11 +
                                                   ((dVar22 * 0.56 + dVar29 * dVar22 + 0.025) -
                                                   dVar21 * dVar16)));
                          iVar2 = movmskps(extraout_EAX_01,auVar18);
                          goto LAB_00118607;
                        }
                      }
                    }
                  }
                }
              }
              else {
                this->_nj1 = '\x01';
                local_1e8 = dVar39;
                local_1d8 = dVar33;
                local_1c8 = dVar27;
                local_1a8 = dVar41;
                CVar42 = IKatan2WithCheck<double>
                                   (dVar34 * -0.0196 +
                                    dVar41 * 0.264 +
                                    dVar29 * -0.03605 +
                                    dVar38 * 0.2884 +
                                    local_1f8 * dVar22 + dVar22 * 0.025 + dVar26 * dVar22 + 0.018025
                                    ,dVar38 * -0.0392 +
                                     dVar34 * -0.5768 +
                                     dVar22 * dVar22 +
                                     dVar29 * -0.264 + dVar41 * -0.03605 + -0.314825,1e-07);
                dVar11 = local_1b0;
                if (((undefined1  [16])CVar42 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  dVar28 = dVar28 + dVar37 + this->sj2 * 0.000875 +
                                             ((this->cj2 * 0.012875 +
                                              this->pz * 0.515 * this->sj2 +
                                              this->cj2 * -0.035 * this->pz +
                                              local_1e8 + local_1c8 + local_1d8 + 0.014) -
                                             dVar19 * dVar30);
                  uVar6 = -(ulong)(0.0 < dVar28);
                  CVar43 = IKPowWithIntegerCheck<double>
                                     ((double)(uVar6 & 0x3ff0000000000000 |
                                              ~uVar6 & -(ulong)(dVar28 < 0.0) & 0xbff0000000000000),
                                      -1);
                  dVar11 = local_1b0;
                  if (((undefined1  [16])CVar43 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    dVar11 = CVar43.value * 1.5707963267949 + CVar42.value + -1.5707963267949;
                    local_1f8 = sin(dVar11);
                    dVar34 = cos(dVar11);
                    if (dVar11 <= 3.14159265358979) {
                      if (dVar11 < -3.14159265358979) {
                        dVar11 = dVar11 + 6.28318530717959;
                      }
                    }
                    else {
                      dVar11 = dVar11 + -6.28318530717959;
                    }
                    this->_ij1[0] = '\0';
                    this->_ij1[1] = 0xff;
                    this->j1 = dVar11;
                    this->cj1 = dVar34;
                    this->sj1 = local_1f8;
                    dVar38 = sin(dVar11);
                    dVar15 = cos(this->j1);
                    dVar16 = this->cj0 * this->px;
                    dVar21 = this->py * this->sj0;
                    dVar22 = this->sj2 * 0.515;
                    dVar34 = this->pz;
                    dVar14 = this->cj2 * 0.035;
                    dVar11 = local_1b0;
                    if (ABS(dVar38 * -0.025 +
                            (((dVar38 * dVar21 + dVar38 * dVar16) - dVar14) - dVar15 * dVar34) +
                            dVar22) <= 1e-05) {
                      dVar29 = this->sj2 * 0.035;
                      dVar11 = this->cj2 * 0.515;
                      auVar20._4_4_ =
                           -(uint)(1e-05 < ABS(dVar14 * -dVar15 +
                                               dVar34 * -1.0 +
                                               dVar38 * dVar11 + dVar38 * 0.56 + dVar38 * dVar29 +
                                               dVar22 * dVar15));
                      auVar20._0_4_ =
                           -(uint)(1e-05 < ABS(((dVar15 * 0.025 + (0.56 - dVar16 * dVar15)) -
                                               dVar21 * dVar15) + dVar29 + dVar11 + dVar34 * -dVar38
                                              ));
                      auVar20._8_4_ =
                           -(uint)(1e-05 < ABS(dVar16 * dVar15 * 1.12 +
                                               this->pp * -1.0 +
                                               dVar15 * 1.12 * dVar21 +
                                               dVar38 * dVar34 * 1.12 +
                                               dVar15 * -0.028 +
                                               dVar16 * 0.05 + dVar21 * 0.05 + -0.047775));
                      auVar20._12_4_ =
                           -(uint)(1e-05 < ABS(dVar15 * dVar29 +
                                               dVar15 * dVar11 +
                                               ((((dVar15 * 0.56 + dVar38 * dVar14 + 0.025) -
                                                 dVar38 * dVar22) - dVar16) - dVar21)));
                      iVar2 = movmskps(extraout_EAX_00,auVar20);
                      goto LAB_00118607;
                    }
                  }
                }
              }
            }
            else {
              this->_nj1 = '\x01';
              local_1a8 = dVar41;
              CVar42 = IKatan2WithCheck<double>
                                 (dVar29 * 0.264 + dVar22 * dVar22 + dVar41 * 0.03605 + -0.265225,
                                  dVar22 * -0.025 +
                                  dVar41 * 0.264 +
                                  dVar29 * -0.03605 +
                                  dVar34 * -0.0196 +
                                  dVar38 * 0.2884 + dVar21 * dVar22 + dVar22 * dVar30 + 0.018025,
                                  1e-07);
              dVar11 = local_1b0;
              if (((undefined1  [16])CVar42 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                dVar11 = this->pz;
                dVar27 = (this->cj2 * 0.000875 +
                         dVar11 * 0.035 * this->sj2 +
                         local_1e8 * dVar30 +
                         this->cj2 * 0.515 * dVar11 +
                         local_1d8 + local_1f8 * local_1c8 + dVar11 * 0.56 + this->sj2 * -0.012875)
                         - dVar27;
                uVar6 = -(ulong)(0.0 < dVar27);
                local_1a8 = CVar42.value;
                CVar42 = IKPowWithIntegerCheck<double>
                                   ((double)(uVar6 & 0x3ff0000000000000 |
                                            ~uVar6 & -(ulong)(dVar27 < 0.0) & 0xbff0000000000000),-1
                                   );
                dVar11 = local_1b0;
                if (((undefined1  [16])CVar42 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  dVar11 = CVar42.value * 1.5707963267949 + local_1a8 + -1.5707963267949;
                  local_1f8 = sin(dVar11);
                  dVar34 = cos(dVar11);
                  if (dVar11 <= 3.14159265358979) {
                    if (dVar11 < -3.14159265358979) {
                      dVar11 = dVar11 + 6.28318530717959;
                    }
                  }
                  else {
                    dVar11 = dVar11 + -6.28318530717959;
                  }
                  this->_ij1[0] = '\0';
                  this->_ij1[1] = 0xff;
                  this->j1 = dVar11;
                  this->cj1 = dVar34;
                  this->sj1 = local_1f8;
                  dVar15 = sin(dVar11);
                  dVar16 = cos(this->j1);
                  dVar14 = this->cj0 * this->px;
                  dVar22 = this->py * this->sj0;
                  dVar38 = this->sj2 * 0.515;
                  dVar34 = this->pz;
                  dVar21 = this->cj2 * 0.035;
                  dVar11 = local_1b0;
                  if (ABS((((dVar15 * -0.025 + dVar15 * dVar22 + dVar15 * dVar14) - dVar16 * dVar34)
                          - dVar21) + dVar38) <= 1e-05) {
                    dVar11 = this->cj2 * 0.515;
                    dVar29 = this->sj2 * 0.035;
                    auVar1._4_4_ = -(uint)(1e-05 < ABS(dVar34 * -1.0 +
                                                       dVar21 * -dVar16 +
                                                       dVar38 * dVar16 +
                                                       dVar15 * dVar29 + dVar15 * dVar11 +
                                                       dVar15 * 0.56));
                    auVar1._0_4_ = -(uint)(1e-05 < ABS(((dVar16 * 0.025 + (0.56 - dVar14 * dVar16))
                                                       - dVar22 * dVar16) + dVar29 + dVar11 +
                                                       dVar34 * -dVar15));
                    auVar1._8_4_ = -(uint)(1e-05 < ABS(dVar14 * 0.05 +
                                                       dVar15 * dVar34 * 1.12 +
                                                       this->pp * -1.0 +
                                                       dVar14 * dVar16 * 1.12 +
                                                       dVar16 * 1.12 * dVar22 +
                                                       dVar16 * -0.028 + -0.047775 + dVar22 * 0.05))
                    ;
                    auVar1._12_4_ =
                         -(uint)(1e-05 < ABS(dVar16 * 0.56 +
                                             dVar16 * dVar11 +
                                             dVar16 * dVar29 +
                                             (((dVar15 * dVar21 + 0.025) - dVar14) - dVar22) +
                                             dVar38 * -dVar15));
                    iVar2 = movmskps(extraout_EAX,auVar1);
LAB_00118607:
                    dVar11 = local_1b0;
                    if (iVar2 == 0) {
                      rotationfunction0(this,solutions);
                      dVar11 = local_1b0;
                    }
                  }
                }
              }
            }
          }
          local_1b0 = dVar11;
        }
      }
    }
  }
LAB_0011861e:
  iVar2 = (*solutions->_vptr_IkSolutionListBase[4])(solutions);
  return CONCAT44(extraout_var,iVar2) != 0;
}

Assistant:

bool ComputeIk(const IkReal* eetrans, const IkReal* eerot, const IkReal* pfree, IkSolutionListBase<IkReal>& solutions) {
j0=numeric_limits<IkReal>::quiet_NaN(); _ij0[0] = -1; _ij0[1] = -1; _nj0 = -1; j1=numeric_limits<IkReal>::quiet_NaN(); _ij1[0] = -1; _ij1[1] = -1; _nj1 = -1; j2=numeric_limits<IkReal>::quiet_NaN(); _ij2[0] = -1; _ij2[1] = -1; _nj2 = -1; j3=numeric_limits<IkReal>::quiet_NaN(); _ij3[0] = -1; _ij3[1] = -1; _nj3 = -1; j4=numeric_limits<IkReal>::quiet_NaN(); _ij4[0] = -1; _ij4[1] = -1; _nj4 = -1; j5=numeric_limits<IkReal>::quiet_NaN(); _ij5[0] = -1; _ij5[1] = -1; _nj5 = -1; 
for(int dummyiter = 0; dummyiter < 1; ++dummyiter) {
    solutions.Clear();
r00 = eerot[0*3+0];
r01 = eerot[0*3+1];
r02 = eerot[0*3+2];
r10 = eerot[1*3+0];
r11 = eerot[1*3+1];
r12 = eerot[1*3+2];
r20 = eerot[2*3+0];
r21 = eerot[2*3+1];
r22 = eerot[2*3+2];
px = eetrans[0]; py = eetrans[1]; pz = eetrans[2];

new_r00=r02;
new_r01=r01;
new_r02=((-1.0)*r00);
new_px=((((-0.08)*r00))+px);
new_r10=((-1.0)*r12);
new_r11=((-1.0)*r11);
new_r12=r10;
new_py=((((-1.0)*py))+(((0.08)*r10)));
new_r20=((-1.0)*r22);
new_r21=((-1.0)*r21);
new_r22=r20;
new_pz=((0.4)+(((-1.0)*pz))+(((0.08)*r20)));
r00 = new_r00; r01 = new_r01; r02 = new_r02; r10 = new_r10; r11 = new_r11; r12 = new_r12; r20 = new_r20; r21 = new_r21; r22 = new_r22; px = new_px; py = new_py; pz = new_pz;
IkReal x54=((1.0)*px);
IkReal x55=((1.0)*pz);
IkReal x56=((1.0)*py);
pp=((px*px)+(py*py)+(pz*pz));
npx=(((px*r00))+((py*r10))+((pz*r20)));
npy=(((px*r01))+((py*r11))+((pz*r21)));
npz=(((px*r02))+((py*r12))+((pz*r22)));
rxp0_0=((((-1.0)*r20*x56))+((pz*r10)));
rxp0_1=(((px*r20))+(((-1.0)*r00*x55)));
rxp0_2=((((-1.0)*r10*x54))+((py*r00)));
rxp1_0=((((-1.0)*r21*x56))+((pz*r11)));
rxp1_1=(((px*r21))+(((-1.0)*r01*x55)));
rxp1_2=((((-1.0)*r11*x54))+((py*r01)));
rxp2_0=(((pz*r12))+(((-1.0)*r22*x56)));
rxp2_1=(((px*r22))+(((-1.0)*r02*x55)));
rxp2_2=((((-1.0)*r12*x54))+((py*r02)));
{
IkReal j0eval[1];
j0eval[0]=((IKabs(px))+(IKabs(py)));
if( IKabs(j0eval[0]) < 0.0000010000000000  )
{
continue; // no branches [j0, j1, j2]

} else
{
{
IkReal j0array[2], cj0array[2], sj0array[2];
bool j0valid[2]={false};
_nj0 = 2;
CheckValue<IkReal> x58 = IKatan2WithCheck(IkReal(py),IkReal(((-1.0)*px)),IKFAST_ATAN2_MAGTHRESH);
if(!x58.valid){
continue;
}
IkReal x57=x58.value;
j0array[0]=((-1.0)*x57);
sj0array[0]=IKsin(j0array[0]);
cj0array[0]=IKcos(j0array[0]);
j0array[1]=((3.14159265358979)+(((-1.0)*x57)));
sj0array[1]=IKsin(j0array[1]);
cj0array[1]=IKcos(j0array[1]);
if( j0array[0] > IKPI )
{
    j0array[0]-=IK2PI;
}
else if( j0array[0] < -IKPI )
{    j0array[0]+=IK2PI;
}
j0valid[0] = true;
if( j0array[1] > IKPI )
{
    j0array[1]-=IK2PI;
}
else if( j0array[1] < -IKPI )
{    j0array[1]+=IK2PI;
}
j0valid[1] = true;
for(int ij0 = 0; ij0 < 2; ++ij0)
{
if( !j0valid[ij0] )
{
    continue;
}
_ij0[0] = ij0; _ij0[1] = -1;
for(int iij0 = ij0+1; iij0 < 2; ++iij0)
{
if( j0valid[iij0] && IKabs(cj0array[ij0]-cj0array[iij0]) < IKFAST_SOLUTION_THRESH && IKabs(sj0array[ij0]-sj0array[iij0]) < IKFAST_SOLUTION_THRESH )
{
    j0valid[iij0]=false; _ij0[1] = iij0; break; 
}
}
j0 = j0array[ij0]; cj0 = cj0array[ij0]; sj0 = sj0array[ij0];

{
IkReal j2array[2], cj2array[2], sj2array[2];
bool j2valid[2]={false};
_nj2 = 2;
if( (((1.00223910638213)+(((-1.72971326121954)*pp))+(((0.0864856630609769)*py*sj0))+(((0.0864856630609769)*cj0*px)))) < -1-IKFAST_SINCOS_THRESH || (((1.00223910638213)+(((-1.72971326121954)*pp))+(((0.0864856630609769)*py*sj0))+(((0.0864856630609769)*cj0*px)))) > 1+IKFAST_SINCOS_THRESH )
    continue;
IkReal x59=IKasin(((1.00223910638213)+(((-1.72971326121954)*pp))+(((0.0864856630609769)*py*sj0))+(((0.0864856630609769)*cj0*px))));
j2array[0]=((-1.50293950393859)+(((-1.0)*x59)));
sj2array[0]=IKsin(j2array[0]);
cj2array[0]=IKcos(j2array[0]);
j2array[1]=((1.6386531496512)+x59);
sj2array[1]=IKsin(j2array[1]);
cj2array[1]=IKcos(j2array[1]);
if( j2array[0] > IKPI )
{
    j2array[0]-=IK2PI;
}
else if( j2array[0] < -IKPI )
{    j2array[0]+=IK2PI;
}
j2valid[0] = true;
if( j2array[1] > IKPI )
{
    j2array[1]-=IK2PI;
}
else if( j2array[1] < -IKPI )
{    j2array[1]+=IK2PI;
}
j2valid[1] = true;
for(int ij2 = 0; ij2 < 2; ++ij2)
{
if( !j2valid[ij2] )
{
    continue;
}
_ij2[0] = ij2; _ij2[1] = -1;
for(int iij2 = ij2+1; iij2 < 2; ++iij2)
{
if( j2valid[iij2] && IKabs(cj2array[ij2]-cj2array[iij2]) < IKFAST_SOLUTION_THRESH && IKabs(sj2array[ij2]-sj2array[iij2]) < IKFAST_SOLUTION_THRESH )
{
    j2valid[iij2]=false; _ij2[1] = iij2; break; 
}
}
j2 = j2array[ij2]; cj2 = cj2array[ij2]; sj2 = sj2array[ij2];

{
IkReal j1eval[3];
IkReal x60=cj2*cj2;
IkReal x61=(cj0*px);
IkReal x62=(cj2*sj2);
IkReal x63=((0.515)*sj2);
IkReal x64=(py*sj0);
IkReal x65=((40.0)*cj2);
IkReal x66=((0.035)*cj2);
IkReal x67=((588.571428571429)*sj2);
IkReal x68=(cj2*pz);
IkReal x69=(pz*sj2);
j1eval[0]=((((-1.0)*x61*x65))+(((640.0)*pz))+cj2+((x61*x67))+(((-14.7142857142857)*sj2))+(((588.571428571429)*x68))+(((-1.0)*x64*x65))+((x64*x67))+(((40.0)*x69)));
j1eval[1]=IKsign(((((-1.0)*x61*x66))+(((0.56)*pz))+(((-0.012875)*sj2))+(((0.035)*x69))+(((0.515)*x68))+((x61*x63))+(((-1.0)*x64*x66))+((x63*x64))+(((0.000875)*cj2))));
j1eval[2]=((IKabs(((-0.265225)+(pz*pz)+(((0.264)*x60))+(((0.03605)*x62)))))+(IKabs(((0.018025)+(((0.2884)*sj2))+(((-0.03605)*x60))+(((-0.0196)*cj2))+(((0.264)*x62))+((pz*x64))+((pz*x61))+(((-0.025)*pz))))));
if( IKabs(j1eval[0]) < 0.0000010000000000  || IKabs(j1eval[1]) < 0.0000010000000000  || IKabs(j1eval[2]) < 0.0000010000000000  )
{
{
IkReal j1eval[2];
IkReal x70=(py*sj0);
IkReal x71=((40.0)*sj2);
IkReal x72=(cj0*px);
IkReal x73=(cj2*pz);
IkReal x74=((0.035)*sj2);
IkReal x75=(pz*sj2);
IkReal x76=((588.571428571429)*cj2);
IkReal x77=((0.515)*cj2);
j1eval[0]=((16.0)+sj2+(((-1.0)*x70*x76))+(((-1.0)*x70*x71))+(((14.7142857142857)*cj2))+(((-40.0)*x73))+(((-1.0)*x71*x72))+(((-640.0)*x70))+(((-640.0)*x72))+(((588.571428571429)*x75))+(((-1.0)*x72*x76)));
j1eval[1]=IKsign(((0.014)+(((0.515)*x75))+(((-1.0)*x70*x77))+(((-1.0)*x70*x74))+(((-0.56)*x72))+(((-0.56)*x70))+(((0.012875)*cj2))+(((-0.035)*x73))+(((0.000875)*sj2))+(((-1.0)*x72*x74))+(((-1.0)*x72*x77))));
if( IKabs(j1eval[0]) < 0.0000010000000000  || IKabs(j1eval[1]) < 0.0000010000000000  )
{
{
IkReal j1eval[2];
IkReal x78=cj0*cj0;
IkReal x79=py*py;
IkReal x80=px*px;
IkReal x81=pz*pz;
IkReal x82=(cj0*px);
IkReal x83=(py*sj0);
IkReal x84=((1600.0)*x79);
IkReal x85=(x78*x80);
j1eval[0]=((-1.0)+((x78*x84))+(((-3200.0)*x82*x83))+(((80.0)*x83))+(((80.0)*x82))+(((-1600.0)*x85))+(((-1600.0)*x81))+(((-1.0)*x84)));
j1eval[1]=IKsign(((-0.000625)+(((0.05)*x83))+(((0.05)*x82))+(((-2.0)*x82*x83))+((x78*x79))+(((-1.0)*x81))+(((-1.0)*x85))+(((-1.0)*x79))));
if( IKabs(j1eval[0]) < 0.0000010000000000  || IKabs(j1eval[1]) < 0.0000010000000000  )
{
continue; // no branches [j1]

} else
{
{
IkReal j1array[1], cj1array[1], sj1array[1];
bool j1valid[1]={false};
_nj1 = 1;
IkReal x86=py*py;
IkReal x87=cj0*cj0;
IkReal x88=(cj0*px);
IkReal x89=((0.515)*sj2);
IkReal x90=(py*sj0);
IkReal x91=((0.035)*cj2);
IkReal x92=((0.035)*sj2);
IkReal x93=((0.515)*cj2);
IkReal x94=(sj2*x90);
CheckValue<IkReal> x95 = IKatan2WithCheck(IkReal(((((-1.0)*pz*x92))+(((-1.0)*pz*x93))+(((-0.012875)*sj2))+((x89*x90))+(((-0.56)*pz))+(((-1.0)*x90*x91))+((x88*x89))+(((-1.0)*x88*x91))+(((0.000875)*cj2)))),IkReal(((0.014)+(((-1.0)*x90*x93))+(((-1.0)*x90*x92))+(((0.012875)*cj2))+((pz*x91))+(((0.000875)*sj2))+(((-1.0)*x88*x92))+(((-1.0)*x88*x93))+(((-0.56)*x90))+(((-0.56)*x88))+(((-1.0)*pz*x89)))),IKFAST_ATAN2_MAGTHRESH);
if(!x95.valid){
continue;
}
CheckValue<IkReal> x96=IKPowWithIntegerCheck(IKsign(((-0.000625)+(((0.05)*x88))+(((0.05)*x90))+((x86*x87))+(((-2.0)*x88*x90))+(((-1.0)*x86))+(((-1.0)*(pz*pz)))+(((-1.0)*x87*(px*px))))),-1);
if(!x96.valid){
continue;
}
j1array[0]=((-1.5707963267949)+(x95.value)+(((1.5707963267949)*(x96.value))));
sj1array[0]=IKsin(j1array[0]);
cj1array[0]=IKcos(j1array[0]);
if( j1array[0] > IKPI )
{
    j1array[0]-=IK2PI;
}
else if( j1array[0] < -IKPI )
{    j1array[0]+=IK2PI;
}
j1valid[0] = true;
for(int ij1 = 0; ij1 < 1; ++ij1)
{
if( !j1valid[ij1] )
{
    continue;
}
_ij1[0] = ij1; _ij1[1] = -1;
for(int iij1 = ij1+1; iij1 < 1; ++iij1)
{
if( j1valid[iij1] && IKabs(cj1array[ij1]-cj1array[iij1]) < IKFAST_SOLUTION_THRESH && IKabs(sj1array[ij1]-sj1array[iij1]) < IKFAST_SOLUTION_THRESH )
{
    j1valid[iij1]=false; _ij1[1] = iij1; break; 
}
}
j1 = j1array[ij1]; cj1 = cj1array[ij1]; sj1 = sj1array[ij1];
{
IkReal evalcond[5];
IkReal x97=IKsin(j1);
IkReal x98=IKcos(j1);
IkReal x99=((0.515)*cj2);
IkReal x100=(cj0*px);
IkReal x101=((0.515)*sj2);
IkReal x102=((0.035)*sj2);
IkReal x103=(py*sj0);
IkReal x104=((1.0)*pz);
IkReal x105=((0.035)*cj2);
IkReal x106=((1.0)*x98);
IkReal x107=((1.12)*x98);
evalcond[0]=(((x100*x97))+((x103*x97))+(((-1.0)*x105))+x101+(((-0.025)*x97))+(((-1.0)*x104*x98)));
evalcond[1]=((0.56)+(((-1.0)*x100*x106))+(((0.025)*x98))+x102+x99+(((-1.0)*x103*x106))+(((-1.0)*x104*x97)));
evalcond[2]=(((x102*x97))+((x101*x98))+(((-1.0)*x104))+((x97*x99))+(((-1.0)*x105*x98))+(((0.56)*x97)));
evalcond[3]=((-0.047775)+((x103*x107))+(((-1.0)*pp))+(((-0.028)*x98))+(((1.12)*pz*x97))+(((0.05)*x103))+(((0.05)*x100))+((x100*x107)));
evalcond[4]=((0.025)+((x102*x98))+(((0.56)*x98))+(((-1.0)*x101*x97))+((x98*x99))+((x105*x97))+(((-1.0)*x103))+(((-1.0)*x100)));
if( IKabs(evalcond[0]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[1]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[2]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[3]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[4]) > IKFAST_EVALCOND_THRESH  )
{
continue;
}
}

rotationfunction0(solutions);
}
}

}

}

} else
{
{
IkReal j1array[1], cj1array[1], sj1array[1];
bool j1valid[1]={false};
_nj1 = 1;
IkReal x610=cj2*cj2;
IkReal x611=(cj2*sj2);
IkReal x612=(py*sj0);
IkReal x613=((0.035)*sj2);
IkReal x614=(cj0*px);
IkReal x615=((1.0)*pz);
IkReal x616=((0.515)*cj2);
CheckValue<IkReal> x617 = IKatan2WithCheck(IkReal(((0.018025)+(((-1.0)*x612*x615))+(((0.025)*pz))+(((-1.0)*x614*x615))+(((0.2884)*sj2))+(((-0.03605)*x610))+(((0.264)*x611))+(((-0.0196)*cj2)))),IkReal(((-0.314825)+(((-0.03605)*x611))+(((-0.264)*x610))+(pz*pz)+(((-0.5768)*cj2))+(((-0.0392)*sj2)))),IKFAST_ATAN2_MAGTHRESH);
if(!x617.valid){
continue;
}
CheckValue<IkReal> x618=IKPowWithIntegerCheck(IKsign(((0.014)+(((-1.0)*x612*x616))+(((-1.0)*x612*x613))+(((-1.0)*x614*x616))+(((-0.035)*cj2*pz))+(((0.515)*pz*sj2))+(((0.012875)*cj2))+(((-1.0)*x613*x614))+(((0.000875)*sj2))+(((-0.56)*x614))+(((-0.56)*x612)))),-1);
if(!x618.valid){
continue;
}
j1array[0]=((-1.5707963267949)+(x617.value)+(((1.5707963267949)*(x618.value))));
sj1array[0]=IKsin(j1array[0]);
cj1array[0]=IKcos(j1array[0]);
if( j1array[0] > IKPI )
{
    j1array[0]-=IK2PI;
}
else if( j1array[0] < -IKPI )
{    j1array[0]+=IK2PI;
}
j1valid[0] = true;
for(int ij1 = 0; ij1 < 1; ++ij1)
{
if( !j1valid[ij1] )
{
    continue;
}
_ij1[0] = ij1; _ij1[1] = -1;
for(int iij1 = ij1+1; iij1 < 1; ++iij1)
{
if( j1valid[iij1] && IKabs(cj1array[ij1]-cj1array[iij1]) < IKFAST_SOLUTION_THRESH && IKabs(sj1array[ij1]-sj1array[iij1]) < IKFAST_SOLUTION_THRESH )
{
    j1valid[iij1]=false; _ij1[1] = iij1; break; 
}
}
j1 = j1array[ij1]; cj1 = cj1array[ij1]; sj1 = sj1array[ij1];
{
IkReal evalcond[5];
IkReal x619=IKsin(j1);
IkReal x620=IKcos(j1);
IkReal x621=((0.515)*cj2);
IkReal x622=(cj0*px);
IkReal x623=((0.515)*sj2);
IkReal x624=((0.035)*sj2);
IkReal x625=(py*sj0);
IkReal x626=((1.0)*pz);
IkReal x627=((0.035)*cj2);
IkReal x628=((1.0)*x620);
IkReal x629=((1.12)*x620);
evalcond[0]=(((x619*x625))+((x619*x622))+(((-1.0)*x627))+(((-1.0)*x620*x626))+(((-0.025)*x619))+x623);
evalcond[1]=((0.56)+(((-1.0)*x622*x628))+(((0.025)*x620))+(((-1.0)*x625*x628))+x624+x621+(((-1.0)*x619*x626)));
evalcond[2]=((((0.56)*x619))+((x619*x624))+((x619*x621))+(((-1.0)*x626))+(((-1.0)*x620*x627))+((x620*x623)));
evalcond[3]=((-0.047775)+(((0.05)*x625))+(((0.05)*x622))+(((-0.028)*x620))+(((1.12)*pz*x619))+((x625*x629))+(((-1.0)*pp))+((x622*x629)));
evalcond[4]=((0.025)+((x619*x627))+(((0.56)*x620))+(((-1.0)*x619*x623))+(((-1.0)*x622))+(((-1.0)*x625))+((x620*x621))+((x620*x624)));
if( IKabs(evalcond[0]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[1]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[2]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[3]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[4]) > IKFAST_EVALCOND_THRESH  )
{
continue;
}
}

rotationfunction0(solutions);
}
}

}

}

} else
{
{
IkReal j1array[1], cj1array[1], sj1array[1];
bool j1valid[1]={false};
_nj1 = 1;
IkReal x630=cj2*cj2;
IkReal x631=(cj0*px);
IkReal x632=((0.035)*cj2);
IkReal x633=(cj2*sj2);
IkReal x634=((0.515)*sj2);
IkReal x635=(py*sj0);
CheckValue<IkReal> x636 = IKatan2WithCheck(IkReal(((-0.265225)+(((0.03605)*x633))+(pz*pz)+(((0.264)*x630)))),IkReal(((0.018025)+((pz*x631))+((pz*x635))+(((0.2884)*sj2))+(((-0.0196)*cj2))+(((-0.03605)*x630))+(((0.264)*x633))+(((-0.025)*pz)))),IKFAST_ATAN2_MAGTHRESH);
if(!x636.valid){
continue;
}
CheckValue<IkReal> x637=IKPowWithIntegerCheck(IKsign(((((0.56)*pz))+(((-0.012875)*sj2))+(((-1.0)*x631*x632))+((x634*x635))+(((0.515)*cj2*pz))+((x631*x634))+(((0.035)*pz*sj2))+(((0.000875)*cj2))+(((-1.0)*x632*x635)))),-1);
if(!x637.valid){
continue;
}
j1array[0]=((-1.5707963267949)+(x636.value)+(((1.5707963267949)*(x637.value))));
sj1array[0]=IKsin(j1array[0]);
cj1array[0]=IKcos(j1array[0]);
if( j1array[0] > IKPI )
{
    j1array[0]-=IK2PI;
}
else if( j1array[0] < -IKPI )
{    j1array[0]+=IK2PI;
}
j1valid[0] = true;
for(int ij1 = 0; ij1 < 1; ++ij1)
{
if( !j1valid[ij1] )
{
    continue;
}
_ij1[0] = ij1; _ij1[1] = -1;
for(int iij1 = ij1+1; iij1 < 1; ++iij1)
{
if( j1valid[iij1] && IKabs(cj1array[ij1]-cj1array[iij1]) < IKFAST_SOLUTION_THRESH && IKabs(sj1array[ij1]-sj1array[iij1]) < IKFAST_SOLUTION_THRESH )
{
    j1valid[iij1]=false; _ij1[1] = iij1; break; 
}
}
j1 = j1array[ij1]; cj1 = cj1array[ij1]; sj1 = sj1array[ij1];
{
IkReal evalcond[5];
IkReal x638=IKsin(j1);
IkReal x639=IKcos(j1);
IkReal x640=((0.515)*cj2);
IkReal x641=(cj0*px);
IkReal x642=((0.515)*sj2);
IkReal x643=((0.035)*sj2);
IkReal x644=(py*sj0);
IkReal x645=((1.0)*pz);
IkReal x646=((0.035)*cj2);
IkReal x647=((1.0)*x639);
IkReal x648=((1.12)*x639);
evalcond[0]=(((x638*x644))+((x638*x641))+(((-0.025)*x638))+(((-1.0)*x639*x645))+(((-1.0)*x646))+x642);
evalcond[1]=((0.56)+(((-1.0)*x641*x647))+(((0.025)*x639))+(((-1.0)*x644*x647))+x643+x640+(((-1.0)*x638*x645)));
evalcond[2]=(((x638*x643))+((x638*x640))+((x639*x642))+(((-1.0)*x639*x646))+(((-1.0)*x645))+(((0.56)*x638)));
evalcond[3]=((-0.047775)+(((-0.028)*x639))+((x644*x648))+((x641*x648))+(((-1.0)*pp))+(((1.12)*pz*x638))+(((0.05)*x641))+(((0.05)*x644)));
evalcond[4]=((0.025)+((x638*x646))+(((-1.0)*x641))+(((-1.0)*x644))+((x639*x643))+((x639*x640))+(((0.56)*x639))+(((-1.0)*x638*x642)));
if( IKabs(evalcond[0]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[1]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[2]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[3]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[4]) > IKFAST_EVALCOND_THRESH  )
{
continue;
}
}

rotationfunction0(solutions);
}
}

}

}
}
}
}
}

}

}
}
return solutions.GetNumSolutions()>0;
}